

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::export_<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *p_Var1;
  char **ppcVar2;
  bool bVar3;
  size_t sVar4;
  Err *pEVar5;
  Name *pNVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  Ok local_632;
  allocator<char> local_631;
  string local_630;
  Err local_610;
  allocator<char> local_5e9;
  string local_5e8;
  Err local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  Err local_580;
  Err local_560;
  Err *local_540;
  Err *err_9;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined1 local_520 [8];
  Result<wasm::Ok> _val_9;
  Err *err_8;
  Result<wasm::Ok> _val_8;
  Result<wasm::Ok> idx_4;
  Err local_470;
  Err *local_450;
  Err *err_7;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined1 local_430 [8];
  Result<wasm::Ok> _val_7;
  Err *err_6;
  Result<wasm::Ok> _val_6;
  Result<wasm::Ok> idx_3;
  Err local_380;
  Err *local_360;
  Err *err_5;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined1 local_340 [8];
  Result<wasm::Ok> _val_5;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  Result<wasm::Ok> idx_2;
  Err local_290;
  Err *local_270;
  Err *err_3;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined1 local_250 [8];
  Result<wasm::Ok> _val_3;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> idx_1;
  Err local_1a0;
  Err *local_180;
  Err *err_1;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined1 local_158 [8];
  Result<wasm::Ok> _val_1;
  Err local_128;
  Err *local_108;
  Err *err;
  Result<wasm::Ok> _val;
  Result<wasm::Ok> idx;
  allocator<char> local_89;
  string local_88;
  Err local_68;
  undefined1 local_48 [8];
  optional<wasm::Name> name;
  size_t pos;
  ParseDeclsCtx *ctx_local;
  
  sVar4 = Lexer::getPos(&ctx->in);
  join_0x00000010_0x00000000_ = sv("export",6);
  bVar3 = Lexer::takeSExprStart(&ctx->in,join_0x00000010_0x00000000_);
  if (bVar3) {
    Lexer::takeName((optional<wasm::Name> *)local_48,&ctx->in);
    bVar3 = std::optional::operator_cast_to_bool((optional *)local_48);
    if (bVar3) {
      bVar7 = sv("func",4);
      bVar3 = Lexer::takeSExprStart(&ctx->in,bVar7);
      if (bVar3) {
        p_Var1 = (__index_type *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
        funcidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,ctx);
        Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err,(Result<wasm::Ok> *)p_Var1);
        local_108 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_108 != (Err *)0x0;
        if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
          wasm::Err::Err(&local_128,local_108);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_128);
          wasm::Err::~Err(&local_128);
        }
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          pNVar6 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_48);
          err_1._0_4_ = (undefined4)(pNVar6->super_IString).str._M_len;
          err_1._4_4_ = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_len + 4);
          ppcVar2 = &(pNVar6->super_IString).str._M_str;
          uStack_170 = *(undefined4 *)ppcVar2;
          uStack_16c = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_str + 4);
          ParseDeclsCtx::addExport
                    (local_158,ctx,sVar4 & 0xffffffff,(pNVar6->super_IString).str._M_len,*ppcVar2,0)
          ;
          local_180 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_158);
          bVar3 = local_180 != (Err *)0x0;
          if (bVar3) {
            wasm::Err::Err(&local_1a0,local_180);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1a0);
            wasm::Err::~Err(&local_1a0);
          }
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar3;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_158);
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
          }
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      else {
        bVar7 = sv("table",5);
        bVar3 = Lexer::takeSExprStart(&ctx->in,bVar7);
        if (bVar3) {
          p_Var1 = (__index_type *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
          tableidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,ctx);
          Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_2,(Result<wasm::Ok> *)p_Var1);
          pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
          if (pEVar5 != (Err *)0x0) {
            wasm::Err::Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar5
                          );
            MaybeResult<wasm::Ok>::MaybeResult
                      (__return_storage_ptr__,
                       (Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            wasm::Err::~Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          }
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar5 != (Err *)0x0;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
            Result<wasm::Ok>::operator*
                      ((Result<wasm::Ok> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            pNVar6 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_48);
            err_3._0_4_ = (undefined4)(pNVar6->super_IString).str._M_len;
            err_3._4_4_ = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_len + 4);
            ppcVar2 = &(pNVar6->super_IString).str._M_str;
            uStack_260 = *(undefined4 *)ppcVar2;
            uStack_25c = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_str + 4);
            ParseDeclsCtx::addExport
                      (local_250,ctx,sVar4 & 0xffffffff,(pNVar6->super_IString).str._M_len,*ppcVar2,
                       1);
            local_270 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_250);
            bVar3 = local_270 != (Err *)0x0;
            if (bVar3) {
              wasm::Err::Err(&local_290,local_270);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_290);
              wasm::Err::~Err(&local_290);
            }
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar3;
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_250);
            if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
            }
          }
          Result<wasm::Ok>::~Result
                    ((Result<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        else {
          bVar7 = sv("memory",6);
          bVar3 = Lexer::takeSExprStart(&ctx->in,bVar7);
          if (bVar3) {
            p_Var1 = (__index_type *)
                     ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
            memidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,ctx);
            Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_4,(Result<wasm::Ok> *)p_Var1);
            pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4);
            if (pEVar5 != (Err *)0x0) {
              wasm::Err::Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                             pEVar5);
              MaybeResult<wasm::Ok>::MaybeResult
                        (__return_storage_ptr__,
                         (Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              wasm::Err::~Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar5 != (Err *)0x0;
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
            if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
              Result<wasm::Ok>::operator*
                        ((Result<wasm::Ok> *)
                         ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              pNVar6 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_48);
              err_5._0_4_ = (undefined4)(pNVar6->super_IString).str._M_len;
              err_5._4_4_ = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_len + 4);
              ppcVar2 = &(pNVar6->super_IString).str._M_str;
              uStack_350 = *(undefined4 *)ppcVar2;
              uStack_34c = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_str + 4);
              ParseDeclsCtx::addExport
                        (local_340,ctx,sVar4 & 0xffffffff,(pNVar6->super_IString).str._M_len,
                         *ppcVar2,2);
              local_360 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_340);
              bVar3 = local_360 != (Err *)0x0;
              if (bVar3) {
                wasm::Err::Err(&local_380,local_360);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_380);
                wasm::Err::~Err(&local_380);
              }
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar3;
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_340);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
              }
            }
            Result<wasm::Ok>::~Result
                      ((Result<wasm::Ok> *)
                       ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          }
          else {
            bVar7 = sv("global",6);
            bVar3 = Lexer::takeSExprStart(&ctx->in,bVar7);
            if (bVar3) {
              p_Var1 = (__index_type *)
                       ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
              globalidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,ctx);
              Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_6,(Result<wasm::Ok> *)p_Var1);
              pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_6);
              if (pEVar5 != (Err *)0x0) {
                wasm::Err::Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                               pEVar5);
                MaybeResult<wasm::Ok>::MaybeResult
                          (__return_storage_ptr__,
                           (Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                wasm::Err::~Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              }
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar5 != (Err *)0x0;
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_6);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                Result<wasm::Ok>::operator*
                          ((Result<wasm::Ok> *)
                           ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                pNVar6 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_48);
                err_7._0_4_ = (undefined4)(pNVar6->super_IString).str._M_len;
                err_7._4_4_ = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_len + 4);
                ppcVar2 = &(pNVar6->super_IString).str._M_str;
                uStack_440 = *(undefined4 *)ppcVar2;
                uStack_43c = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_str + 4);
                ParseDeclsCtx::addExport
                          (local_430,ctx,sVar4 & 0xffffffff,(pNVar6->super_IString).str._M_len,
                           *ppcVar2,3);
                local_450 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_430);
                bVar3 = local_450 != (Err *)0x0;
                if (bVar3) {
                  wasm::Err::Err(&local_470,local_450);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_470);
                  wasm::Err::~Err(&local_470);
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar3;
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_430);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                }
              }
              Result<wasm::Ok>::~Result
                        ((Result<wasm::Ok> *)
                         ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            else {
              bVar7 = sv("tag",3);
              bVar3 = Lexer::takeSExprStart(&ctx->in,bVar7);
              if (!bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5a0,"expected export description",&local_5a1);
                Lexer::err(&local_580,&ctx->in,&local_5a0);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_580);
                wasm::Err::~Err(&local_580);
                std::__cxx11::string::~string((string *)&local_5a0);
                std::allocator<char>::~allocator(&local_5a1);
                return __return_storage_ptr__;
              }
              p_Var1 = (__index_type *)
                       ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
              tagidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,ctx);
              Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_8,(Result<wasm::Ok> *)p_Var1);
              pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_8);
              if (pEVar5 != (Err *)0x0) {
                wasm::Err::Err((Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                               pEVar5);
                MaybeResult<wasm::Ok>::MaybeResult
                          (__return_storage_ptr__,
                           (Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                wasm::Err::~Err((Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              }
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar5 != (Err *)0x0;
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_8);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                Result<wasm::Ok>::operator*
                          ((Result<wasm::Ok> *)
                           ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                pNVar6 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_48);
                err_9._0_4_ = (undefined4)(pNVar6->super_IString).str._M_len;
                err_9._4_4_ = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_len + 4);
                ppcVar2 = &(pNVar6->super_IString).str._M_str;
                uStack_530 = *(undefined4 *)ppcVar2;
                uStack_52c = *(undefined4 *)((long)&(pNVar6->super_IString).str._M_str + 4);
                ParseDeclsCtx::addExport
                          (local_520,ctx,sVar4 & 0xffffffff,(pNVar6->super_IString).str._M_len,
                           *ppcVar2,4);
                local_540 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_520);
                bVar3 = local_540 != (Err *)0x0;
                if (bVar3) {
                  wasm::Err::Err(&local_560,local_540);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_560);
                  wasm::Err::~Err(&local_560);
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar3;
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_520);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                }
              }
              Result<wasm::Ok>::~Result
                        ((Result<wasm::Ok> *)
                         ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
          }
        }
      }
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        bVar3 = Lexer::takeRParen(&ctx->in);
        if (bVar3) {
          bVar3 = Lexer::takeRParen(&ctx->in);
          if (bVar3) {
            MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_632);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_630,"expected end of export",&local_631);
            Lexer::err(&local_610,&ctx->in,&local_630);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_610);
            wasm::Err::~Err(&local_610);
            std::__cxx11::string::~string((string *)&local_630);
            std::allocator<char>::~allocator(&local_631);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e8,"expected end of export description",&local_5e9);
          Lexer::err(&local_5c8,&ctx->in,&local_5e8);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_5c8);
          wasm::Err::~Err(&local_5c8);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::allocator<char>::~allocator(&local_5e9);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"expected export name",&local_89);
      Lexer::err(&local_68,&ctx->in,&local_88);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_68);
      wasm::Err::~Err(&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> export_(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("export"sv)) {
    return {};
  }

  auto name = ctx.in.takeName();
  if (!name) {
    return ctx.in.err("expected export name");
  }

  if (ctx.in.takeSExprStart("func"sv)) {
    auto idx = funcidx(ctx);
    CHECK_ERR(idx);
    CHECK_ERR(ctx.addExport(pos, *idx, *name, ExternalKind::Function));
  } else if (ctx.in.takeSExprStart("table"sv)) {
    auto idx = tableidx(ctx);
    CHECK_ERR(idx);
    CHECK_ERR(ctx.addExport(pos, *idx, *name, ExternalKind::Table));
  } else if (ctx.in.takeSExprStart("memory"sv)) {
    auto idx = memidx(ctx);
    CHECK_ERR(idx);
    CHECK_ERR(ctx.addExport(pos, *idx, *name, ExternalKind::Memory));
  } else if (ctx.in.takeSExprStart("global"sv)) {
    auto idx = globalidx(ctx);
    CHECK_ERR(idx);
    CHECK_ERR(ctx.addExport(pos, *idx, *name, ExternalKind::Global));
  } else if (ctx.in.takeSExprStart("tag"sv)) {
    auto idx = tagidx(ctx);
    CHECK_ERR(idx);
    CHECK_ERR(ctx.addExport(pos, *idx, *name, ExternalKind::Tag));
  } else {
    return ctx.in.err("expected export description");
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of export description");
  }
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of export");
  }
  return Ok{};
}